

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmCommonTargetGenerator::AppendOSXVerFlag
          (cmCommonTargetGenerator *this,string *flags,string *lang,char *name,bool so)

{
  cmLocalCommonGenerator *pcVar1;
  cmValue cVar2;
  ostream *poVar3;
  char *pcVar4;
  int patch;
  int minor;
  int major;
  string prop;
  string fallback_prop;
  string fvar;
  ostringstream vflag;
  int local_24c;
  int local_248;
  int local_244;
  char *local_240;
  string local_238 [32];
  string local_218;
  cmAlphaNum local_1f8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  local_1a8._0_8_ = &DAT_00000006;
  local_1a8._8_8_ = "CMAKE_";
  local_1f8.View_._M_str = (lang->_M_dataplus)._M_p;
  local_1f8.View_._M_len = lang->_M_string_length;
  local_240 = name;
  cmStrCat<char[6],char_const*,char[14]>
            (&local_1c8,(cmAlphaNum *)local_1a8,&local_1f8,(char (*) [6])"_OSX_",&local_240,
             (char (*) [14])"_VERSION_FLAG");
  cVar2 = cmMakefile::GetDefinition(this->Makefile,&local_1c8);
  pcVar4 = local_240;
  if (cVar2.Value != (string *)0x0) {
    local_1a8._0_8_ = &DAT_00000006;
    local_1a8._8_8_ = "MACHO_";
    local_1f8.View_._M_len = strlen(local_240);
    local_1f8.View_._M_str = pcVar4;
    cmStrCat<char[9]>(&local_218,(cmAlphaNum *)local_1a8,&local_1f8,(char (*) [9])0x620bcd);
    pcVar4 = "VERSION";
    if (so) {
      pcVar4 = "SOVERSION";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,pcVar4,(allocator<char> *)local_1a8);
    cmGeneratorTarget::GetTargetVersionFallback
              (this->GeneratorTarget,&local_218,(string *)&local_1f8,&local_244,&local_248,
               &local_24c);
    if (((0 < local_244) || (0 < local_248)) || (0 < local_24c)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar3 = std::operator<<((ostream *)local_1a8,(string *)cVar2.Value);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_244);
      poVar3 = std::operator<<(poVar3,".");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_248);
      poVar3 = std::operator<<(poVar3,".");
      std::ostream::operator<<(poVar3,local_24c);
      pcVar1 = this->LocalCommonGenerator;
      std::__cxx11::stringbuf::str();
      (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar1,flags,local_238);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendOSXVerFlag(std::string& flags,
                                               const std::string& lang,
                                               const char* name, bool so)
{
  // Lookup the flag to specify the version.
  std::string fvar = cmStrCat("CMAKE_", lang, "_OSX_", name, "_VERSION_FLAG");
  cmValue flag = this->Makefile->GetDefinition(fvar);

  // Skip if no such flag.
  if (!flag) {
    return;
  }

  // Lookup the target version information.
  int major;
  int minor;
  int patch;
  std::string prop = cmStrCat("MACHO_", name, "_VERSION");
  std::string fallback_prop = so ? "SOVERSION" : "VERSION";
  this->GeneratorTarget->GetTargetVersionFallback(prop, fallback_prop, major,
                                                  minor, patch);
  if (major > 0 || minor > 0 || patch > 0) {
    // Append the flag since a non-zero version is specified.
    std::ostringstream vflag;
    vflag << *flag << major << "." << minor << "." << patch;
    this->LocalCommonGenerator->AppendFlags(flags, vflag.str());
  }
}